

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::IO::readVector<TasGrid::IO::mode_binary_type,double,int>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,IO *this,istream *is,
          int num_entries)

{
  size_type __n;
  allocator<double> local_1e;
  undefined1 local_1d;
  int local_1c;
  IO *pIStack_18;
  int num_entries_local;
  istream *is_local;
  vector<double,_std::allocator<double>_> *x;
  
  local_1c = (int)is;
  local_1d = 0;
  __n = (size_type)local_1c;
  pIStack_18 = this;
  is_local = (istream *)__return_storage_ptr__;
  ::std::allocator<double>::allocator(&local_1e);
  ::std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__n,&local_1e);
  ::std::allocator<double>::~allocator(&local_1e);
  readVector<TasGrid::IO::mode_binary_type,double>((istream *)pIStack_18,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<VecType> readVector(std::istream &is, SizeType num_entries){
    std::vector<VecType> x((size_t) num_entries);
    readVector<iomode, VecType>(is, x);
    return x;
}